

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_texture_op(CompilerMSL *this,Instruction *i,bool sparse)

{
  uint32_t result_type;
  uint32_t result_id;
  uint32_t id;
  uint32_t *puVar1;
  SPIRType *pSVar2;
  CompilerError *this_00;
  undefined7 in_register_00000011;
  string expr;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000011,sparse) != 0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Sparse feedback not yet supported in MSL.");
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((this->msl_options).use_framebuffer_fetch_subpasses == true) {
    puVar1 = Compiler::stream((Compiler *)this,i);
    result_type = *puVar1;
    result_id = puVar1[1];
    id = puVar1[2];
    pSVar2 = Compiler::expression_type((Compiler *)this,id);
    pSVar2 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        (pSVar2->super_IVariant).self.id);
    if ((pSVar2->image).dim == DimSubpassData) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id,true);
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,result_id,&local_50,true,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return;
      }
      operator_delete(local_50._M_dataplus._M_p);
      return;
    }
  }
  CompilerGLSL::emit_texture_op(&this->super_CompilerGLSL,i,false);
  return;
}

Assistant:

void CompilerMSL::emit_texture_op(const Instruction &i, bool sparse)
{
	if (sparse)
		SPIRV_CROSS_THROW("Sparse feedback not yet supported in MSL.");

	if (msl_options.use_framebuffer_fetch_subpasses)
	{
		auto *ops = stream(i);

		uint32_t result_type_id = ops[0];
		uint32_t id = ops[1];
		uint32_t img = ops[2];

		auto &type = expression_type(img);
		auto &imgtype = get<SPIRType>(type.self);

		// Use Metal's native frame-buffer fetch API for subpass inputs.
		if (imgtype.image.dim == DimSubpassData)
		{
			// Subpass inputs cannot be invalidated,
			// so just forward the expression directly.
			string expr = to_expression(img);
			emit_op(result_type_id, id, expr, true);
			return;
		}
	}

	// Fallback to default implementation
	CompilerGLSL::emit_texture_op(i, sparse);
}